

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiAgentDecisionProcessDiscreteFactoredStates.cpp
# Opt level: O2

double __thiscall
MultiAgentDecisionProcessDiscreteFactoredStates::GetObservationProbability
          (MultiAgentDecisionProcessDiscreteFactoredStates *this,Index jaI,Index sucSI,Index joI)

{
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar1;
  double in_XMM0_Qa;
  double dVar2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> A;
  vector<unsigned_int,_std::allocator<unsigned_int>_> Y;
  vector<unsigned_int,_std::allocator<unsigned_int>_> O;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_60;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_30;
  
  if (this->_m_cached_FlatOM == true) {
    (*(this->_m_p_oModel->super_ObservationModelDiscreteInterface).super_ObservationModel.
      _vptr_ObservationModel[4])(this->_m_p_oModel,jaI,(ulong)sucSI);
    return in_XMM0_Qa;
  }
  pvVar1 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
           (**(code **)(*(long *)&this->super_MultiAgentDecisionProcess + 400))(this,joI);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_30,pvVar1);
  (**(code **)(*(long *)&this->super_MultiAgentDecisionProcess + 0xd8))(&local_48,this,sucSI);
  pvVar1 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
           (**(code **)(*(long *)&this->super_MultiAgentDecisionProcess + 0x140))(this,jaI);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_60,pvVar1);
  dVar2 = TwoStageDynamicBayesianNetwork::GetOProbability
                    (&this->_m_2dbn,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_60
                     ,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_30);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_60);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_48);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_30);
  return dVar2;
}

Assistant:

double MultiAgentDecisionProcessDiscreteFactoredStates::
GetObservationProbability  (Index jaI, Index sucSI, Index joI) const
{
    if(_m_cached_FlatOM)
        return _m_p_oModel->Get(jaI, sucSI, joI);
    vector<Index> O = JointToIndividualObservationIndices(joI);
    vector<Index> Y = StateIndexToFactorValueIndices(sucSI);
    vector<Index> A = JointToIndividualActionIndices(jaI);
    return(_m_2dbn.GetOProbability(A,Y,O));    
}